

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int GetAllSupportedScanModesRPLIDAR(RPLIDAR *pRPLIDAR,RPLIDARSCANMODE *pScanModes)

{
  int iVar1;
  uint local_80;
  uint maxdistance;
  uint uspersample;
  uint i;
  ushort uStack_64;
  unsigned_short scanmodecount;
  uchar databuf [68];
  RPLIDARSCANMODE *pScanModes_local;
  RPLIDAR *pRPLIDAR_local;
  
  uspersample._2_2_ = 0;
  maxdistance = 0;
  unique0x10000331 = pScanModes;
  memset(&i,0,0x44);
  iVar1 = GetConfRPLIDAR(pRPLIDAR,0x70,(uchar *)0x0,0,(uchar *)&i,6);
  if (iVar1 == 0) {
    if ((char)i == 'p') {
      uspersample._2_2_ = uStack_64;
      if (uStack_64 == 0) {
        printf("A RPLIDAR is not responding correctly. \n");
      }
      else {
        if (0x10 < uStack_64) {
          printf("Warning : RPLIDAR unsupported scanmodes. \n");
        }
        memset(stack0xffffffffffffffe0,0,0x600);
        maxdistance = 0;
        while( true ) {
          if (uspersample._2_2_ < 0x10) {
            local_80 = (uint)uspersample._2_2_;
          }
          else {
            local_80 = 0x10;
          }
          if (local_80 <= maxdistance) {
            return 0;
          }
          stack0xffffffffffffffe0[maxdistance].id = maxdistance;
          memset(&i,0,0x44);
          iVar1 = GetConfRPLIDAR(pRPLIDAR,0x71,(uchar *)&maxdistance,2,(uchar *)&i,8);
          if (iVar1 != 0) {
            return 1;
          }
          if ((char)i != 'q') {
            printf("A RPLIDAR is not responding correctly : Bad response payload type. \n");
            return 1;
          }
          stack0xffffffffffffffe0[maxdistance].us_per_sample = (double)(_uStack_64 >> 8);
          memset(&i,0,0x44);
          iVar1 = GetConfRPLIDAR(pRPLIDAR,0x74,(uchar *)&maxdistance,2,(uchar *)&i,8);
          if (iVar1 != 0) {
            return 1;
          }
          if ((char)i != 't') {
            printf("A RPLIDAR is not responding correctly : Bad response payload type. \n");
            return 1;
          }
          stack0xffffffffffffffe0[maxdistance].max_distance = (double)(_uStack_64 >> 8);
          memset(&i,0,0x44);
          iVar1 = GetConfRPLIDAR(pRPLIDAR,0x75,(uchar *)&maxdistance,2,(uchar *)&i,5);
          if (iVar1 != 0) {
            return 1;
          }
          if ((char)i != 'u') {
            printf("A RPLIDAR is not responding correctly : Bad response payload type. \n");
            return 1;
          }
          stack0xffffffffffffffe0[maxdistance].ans_type = _uStack_64 & 0xff;
          memset(&i,0,0x44);
          iVar1 = GetConfRPLIDAR(pRPLIDAR,0x7f,(uchar *)&maxdistance,2,(uchar *)&i,0x40);
          if (iVar1 != 0) {
            return 1;
          }
          if ((char)i != '\x7f') break;
          memset(stack0xffffffffffffffe0[maxdistance].scan_mode,0,0x40);
          memcpy(stack0xffffffffffffffe0[maxdistance].scan_mode,&stack0xffffffffffffff9c,0x40);
          maxdistance = maxdistance + 1;
        }
        printf("A RPLIDAR is not responding correctly : Bad response payload type. \n");
      }
    }
    else {
      printf("A RPLIDAR is not responding correctly : Bad response payload type. \n");
    }
  }
  return 1;
}

Assistant:

inline int GetAllSupportedScanModesRPLIDAR(RPLIDAR* pRPLIDAR, RPLIDARSCANMODE* pScanModes)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
#ifdef FORCE_RPLIDAR_SDK_V1
	std::vector<RplidarScanMode> outModes;
#else
	std::vector<LidarScanMode> outModes;
#endif // FORCE_RPLIDAR_SDK_V1
	unsigned int i = 0;

	if (SL_IS_FAIL(pRPLIDAR->drv->getAllSupportedScanModes(outModes)))
	{
		printf("A RPLIDAR is not responding correctly : getAllSupportedScanModes() failed. \n");
		return EXIT_FAILURE;
	}
	if (outModes.size() > MAX_NB_SCAN_MODES_RPLIDAR) printf("Warning : RPLIDAR unsupported scanmodes. \n");
	memset(pScanModes, 0, sizeof(RPLIDARSCANMODE)*MAX_NB_SCAN_MODES_RPLIDAR);
	for (i = 0; i < min(outModes.size(), (unsigned int)MAX_NB_SCAN_MODES_RPLIDAR); i++)
	{
		pScanModes[i].id = (int)outModes[i].id;
		pScanModes[i].us_per_sample = (double)outModes[i].us_per_sample;
		pScanModes[i].max_distance = (double)outModes[i].max_distance;
		pScanModes[i].ans_type = (int)outModes[i].ans_type;
		memcpy(pScanModes[i].scan_mode, outModes[i].scan_mode, sizeof(pScanModes[i].scan_mode));
	}
	return EXIT_SUCCESS;
#else
	unsigned char databuf[68];
	unsigned short scanmodecount = 0;
	unsigned int i = 0, uspersample = 0, maxdistance = 0;

	memset(databuf, 0, sizeof(databuf));
	if (GetConfRPLIDAR(pRPLIDAR, LIDAR_CONF_SCAN_MODE_COUNT_RPLIDAR, NULL, 0, databuf, 6) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (databuf[0] != (unsigned char)LIDAR_CONF_SCAN_MODE_COUNT_RPLIDAR)
	{
		printf("A RPLIDAR is not responding correctly : Bad response payload type. \n");
		return EXIT_FAILURE;
	}
	scanmodecount = (unsigned short)((databuf[5]<<8)|databuf[4]);
	if (scanmodecount <= 0)
	{
		printf("A RPLIDAR is not responding correctly. \n");
		return EXIT_FAILURE;
	}
	if (scanmodecount > MAX_NB_SCAN_MODES_RPLIDAR) printf("Warning : RPLIDAR unsupported scanmodes. \n");

	memset(pScanModes, 0, sizeof(RPLIDARSCANMODE)*MAX_NB_SCAN_MODES_RPLIDAR);
	for (i = 0; i < min(scanmodecount, (unsigned int)MAX_NB_SCAN_MODES_RPLIDAR); i++)
	{
		pScanModes[i].id = (int)i;
		memset(databuf, 0, sizeof(databuf));
		if (GetConfRPLIDAR(pRPLIDAR, LIDAR_CONF_SCAN_MODE_US_PER_SAMPLE_RPLIDAR, (unsigned char*)&i, 2, databuf, 8) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		if (databuf[0] != (unsigned char)LIDAR_CONF_SCAN_MODE_US_PER_SAMPLE_RPLIDAR)
		{
			printf("A RPLIDAR is not responding correctly : Bad response payload type. \n");
			return EXIT_FAILURE;
		}
		memcpy((unsigned char*)&uspersample, databuf+4, 4);
		pScanModes[i].us_per_sample = (double)(uspersample/(1<<8));

		memset(databuf, 0, sizeof(databuf));
		if (GetConfRPLIDAR(pRPLIDAR, LIDAR_CONF_SCAN_MODE_MAX_DISTANCE_RPLIDAR, (unsigned char*)&i, 2, databuf, 8) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		if (databuf[0] != (unsigned char)LIDAR_CONF_SCAN_MODE_MAX_DISTANCE_RPLIDAR)
		{
			printf("A RPLIDAR is not responding correctly : Bad response payload type. \n");
			return EXIT_FAILURE;
		}
		memcpy((unsigned char*)&maxdistance, databuf+4, 4);
		pScanModes[i].max_distance = (double)(maxdistance/(1<<8));

		memset(databuf, 0, sizeof(databuf));
		if (GetConfRPLIDAR(pRPLIDAR, LIDAR_CONF_SCAN_MODE_ANS_TYPE_RPLIDAR, (unsigned char*)&i, 2, databuf, 5) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		if (databuf[0] != (unsigned char)LIDAR_CONF_SCAN_MODE_ANS_TYPE_RPLIDAR)
		{
			printf("A RPLIDAR is not responding correctly : Bad response payload type. \n");
			return EXIT_FAILURE;
		}
		pScanModes[i].ans_type = (int)databuf[4];

		memset(databuf, 0, sizeof(databuf));
		if (GetConfRPLIDAR(pRPLIDAR, LIDAR_CONF_SCAN_MODE_NAME_RPLIDAR, (unsigned char*)&i, 2, databuf, 64) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		if (databuf[0] != (unsigned char)LIDAR_CONF_SCAN_MODE_NAME_RPLIDAR)
		{
			printf("A RPLIDAR is not responding correctly : Bad response payload type. \n");
			return EXIT_FAILURE;
		}
		memset(pScanModes[i].scan_mode, 0, sizeof(pScanModes[i].scan_mode));
		memcpy(pScanModes[i].scan_mode, databuf+4, sizeof(pScanModes[i].scan_mode));
	}
	return EXIT_SUCCESS;
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
}